

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcMasterTable.cpp
# Opt level: O0

GrcMasterValueList * __thiscall GrcMasterTable::ValueListFor(GrcMasterTable *this,Symbol psym)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_> *in_RDI;
  iterator hmit;
  GrcMasterValueList *pmvl;
  map<GrcSymbolTableEntry_*,_GrcMasterValueList_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20;
  GrcMasterValueList *local_18;
  
  local_20._M_node =
       (_Base_ptr)
       std::
       map<GrcSymbolTableEntry_*,_GrcMasterValueList_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x1bcdf2);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<GrcSymbolTableEntry_*,_GrcMasterValueList_*,_std::less<GrcSymbolTableEntry_*>,_std::allocator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator==(&local_20,&local_28);
  if (bVar1) {
    local_18 = (GrcMasterValueList *)0x0;
  }
  else {
    ppVar2 = std::_Rb_tree_iterator<std::pair<GrcSymbolTableEntry_*const,_GrcMasterValueList_*>_>::
             operator->(in_RDI);
    local_18 = ppVar2->second;
  }
  return local_18;
}

Assistant:

GrcMasterValueList * GrcMasterTable::ValueListFor(Symbol psym)
{
	Assert(psym->FitsSymbolType(ksymtClass) || psym->FitsSymbolType(ksymtFeature));

	GrcMasterValueList * pmvl;
	ValueListMap::iterator hmit = m_vlistmapEntries.find(psym);
	if (hmit == m_vlistmapEntries.end())
		pmvl = NULL;
	else
        pmvl = hmit->second;
	//m_vlistmapEntries.Retrieve(psym, &pmvl);
	return pmvl;
}